

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O2

ptr<resp_msg> __thiscall nuraft::raft_server::handle_prevote_req(raft_server *this,req_msg *req)

{
  uint uVar1;
  pointer psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _func_int **pp_Var5;
  int iVar6;
  iterator iVar7;
  long lVar8;
  srv_role _role;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  char *pcVar10;
  shared_ptr<nuraft::resp_msg> sVar11;
  undefined1 auVar12 [16];
  ptr<resp_msg> pVar13;
  string local_a8;
  ulong next_idx_for_resp;
  undefined4 local_80;
  undefined4 uStack_7c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  pointer local_70;
  raft_server *local_68;
  undefined8 local_60;
  undefined8 local_58;
  string local_50;
  
  next_idx_for_resp = 0;
  local_a8._M_dataplus._M_p._0_4_ = *(undefined4 *)(in_RDX + 0x14);
  iVar7 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(req + 6),(key_type_conflict *)&local_a8);
  if (iVar7.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    next_idx_for_resp = 0xffffffffffffffff;
  }
  psVar2 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (psVar2 != (pointer)0x0) {
    iVar6 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    if (3 < iVar6) {
      psVar2 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      srv_role_to_string_abi_cxx11_
                (&local_50,
                 (nuraft *)
                 (ulong)*(uint *)&req[8].log_entries_.
                                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,_role);
      local_58 = CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_);
      uVar1 = *(uint *)(in_RDX + 0x14);
      local_60 = *(undefined8 *)(in_RDX + 0x20);
      (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x20))(&local_80);
      uVar3 = *(undefined8 *)CONCAT44(uStack_7c,local_80);
      uVar4 = *(undefined8 *)(in_RDX + 0x28);
      local_70 = psVar2;
      local_68 = this;
      lVar8 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      pcVar10 = "HB dead";
      if ((req[2].last_log_term_ & 1) != 0) {
        pcVar10 = "HB alive";
      }
      msg_if_given_abi_cxx11_
                (&local_a8,
                 "[PRE-VOTE REQ] my role %s, from peer %d, log term: req %lu / mine %lu\nlast idx: req %lu / mine %lu, term: req %lu / mine %lu\n%s"
                 ,local_58,(ulong)uVar1,local_60,uVar3,uVar4,lVar8 + -1,*(undefined8 *)(in_RDX + 8),
                 req[9].super_msg_base._vptr_msg_base[1],pcVar10);
      (*(code *)(local_70->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(local_70,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                        ,"handle_prevote_req",0x19d,&local_a8);
      this = local_68;
      std::__cxx11::string::~string((string *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  local_a8._M_dataplus._M_p = *(pointer *)(in_RDX + 8);
  local_50._M_dataplus._M_p._0_4_ = 0x15;
  local_80 = *(undefined4 *)(in_RDX + 0x14);
  sVar11 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long&>
                     ((unsigned_long *)this,(msg_type *)&local_a8,(int *)&local_50,
                      (int *)&req->log_entries_,(unsigned_long *)&local_80);
  _Var9 = sVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((((ulong)req[2].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) &&
     (psVar2 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar2 != (pointer)0x0)) {
    iVar6 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var9._M_pi = extraout_RDX;
    if (3 < iVar6) {
      psVar2 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_(&local_a8,"this server is catching up, always accept pre-vote");
      (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar2,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                        ,"handle_prevote_req",0x1ad,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      _Var9._M_pi = extraout_RDX_00;
    }
  }
  if (((req[2].last_log_term_ & 1) == 0) ||
     (((ulong)req[2].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0)) {
    psVar2 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar2 != (pointer)0x0) {
      iVar6 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (3 < iVar6) {
        psVar2 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: O (grant)");
        (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_req",0x1b0,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
    pp_Var5 = this->_vptr_raft_server;
    auVar12 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    _Var9._M_pi = auVar12._8_8_;
    pp_Var5[4] = auVar12._0_8_;
    *(undefined1 *)(pp_Var5 + 6) = 1;
    goto LAB_001a41a7;
  }
  psVar2 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (next_idx_for_resp == 0xffffffffffffffff) {
    if (psVar2 == (pointer)0x0) goto LAB_001a41a7;
    iVar6 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var9._M_pi = extraout_RDX_02;
    if (iVar6 < 4) goto LAB_001a41a7;
    psVar2 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: XX (strong deny, non-existing node)");
    (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar2,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_prevote_req",0x1b6,&local_a8);
  }
  else {
    if (psVar2 == (pointer)0x0) goto LAB_001a41a7;
    iVar6 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var9._M_pi = extraout_RDX_01;
    if (iVar6 < 4) goto LAB_001a41a7;
    psVar2 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: X (deny)");
    (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar2,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_prevote_req",0x1b4,&local_a8);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  _Var9._M_pi = extraout_RDX_03;
LAB_001a41a7:
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_prevote_req(req_msg& req) {
    ulong next_idx_for_resp = 0;
    auto entry = peers_.find(req.get_src());
    if (entry == peers_.end()) {
        // This node already has been removed, set a special value.
        next_idx_for_resp = std::numeric_limits<ulong>::max();
    }

    p_in("[PRE-VOTE REQ] my role %s, from peer %d, "
         "log term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "last idx: req %" PRIu64 " / mine %" PRIu64
         ", term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "%s",
         srv_role_to_string(role_).c_str(),
         req.get_src(), req.get_last_log_term(),
         log_store_->last_entry()->get_term(),
         req.get_last_log_idx(), log_store_->next_slot()-1,
         req.get_term(), state_->get_term(),
         (hb_alive_) ? "HB alive" : "HB dead");

    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( req.get_term(),
            msg_type::pre_vote_response,
            id_,
            req.get_src(),
            next_idx_for_resp ) );

    // NOTE:
    //   While `catching_up_` flag is on, this server does not get
    //   normal append_entries request so that `hb_alive_` may not
    //   be cleared properly. Hence, it should accept any pre-vote
    //   requests.
    if (catching_up_) {
        p_in("this server is catching up, always accept pre-vote");
    }
    if (!hb_alive_ || catching_up_) {
        p_in("pre-vote decision: O (grant)");
        resp->accept(log_store_->next_slot());
    } else {
        if (next_idx_for_resp != std::numeric_limits<ulong>::max()) {
            p_in("pre-vote decision: X (deny)");
        } else {
            p_in("pre-vote decision: XX (strong deny, non-existing node)");
        }
    }

    return resp;
}